

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void __thiscall CFG::removeNullableSymbol(CFG *this,string *symbol,Production *production)

{
  pointer *pppPVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t sVar2;
  iterator iVar3;
  int iVar4;
  Production *pPVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  CFG *pCVar9;
  vector<Production_*,_std::allocator<Production_*>_> *__x;
  CFG *this_01;
  int iVar10;
  ulong uVar11;
  value_type *pvVar12;
  bool bVar13;
  Production *newProduction;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  permutations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  productionsTo;
  Production *newProduction_1;
  undefined1 local_138 [16];
  pointer local_128;
  uint local_120;
  _Bit_pointer local_118;
  undefined1 local_108 [104];
  undefined8 uStack_a0;
  undefined8 local_98;
  vector<Production*,std::allocator<Production*>> *local_88;
  Production *local_80;
  Production *local_78;
  ulong local_70;
  vector<Production_*,_std::allocator<Production_*>_> local_68;
  Production *local_50;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_48;
  
  local_108._24_8_ = production;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_108 + 0x28),&production->toP);
  local_108._96_8_ = 0;
  uStack_a0 = 0;
  local_98 = 0;
  local_108._32_8_ = this;
  if (local_108._48_8_ == local_108._40_8_) {
    iVar10 = 0;
    bVar13 = false;
  }
  else {
    lVar8 = 0;
    uVar11 = 0;
    bVar13 = false;
    iVar10 = 0;
    do {
      sVar2 = *(size_t *)((long)(local_108._40_8_ + 8) + lVar8);
      pvVar12 = (value_type *)((long)&((_Alloc_hider *)local_108._40_8_)->_M_p + lVar8);
      if ((sVar2 == symbol->_M_string_length) &&
         ((sVar2 == 0 ||
          (iVar4 = bcmp((pvVar12->_M_dataplus)._M_p,(symbol->_M_dataplus)._M_p,sVar2), iVar4 == 0)))
         ) {
        iVar10 = iVar10 + 1;
        bVar13 = true;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_108 + 0x60),pvVar12);
      }
      uVar11 = uVar11 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar11 < (ulong)((long)(local_108._48_8_ - local_108._40_8_) >> 5));
  }
  pCVar9 = (CFG *)local_108._32_8_;
  if (bVar13) {
    pPVar5 = (Production *)operator_new(0x38);
    Production::Production
              (pPVar5,(string *)local_108._24_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_108 + 0x60));
    iVar3._M_current =
         (((vector<Production_*,_std::allocator<Production_*>_> *)((long)pCVar9 + 0x30))->
         super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_138._0_8_ = pPVar5;
    if (iVar3._M_current ==
        (((vector<Production_*,_std::allocator<Production_*>_> *)((long)pCVar9 + 0x30))->
        super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Production*,std::allocator<Production*>>::_M_realloc_insert<Production*const&>
                ((vector<Production*,std::allocator<Production*>> *)((long)pCVar9 + 0x30),iVar3,
                 (Production **)local_138);
    }
    else {
      *iVar3._M_current = pPVar5;
      pppPVar1 = &(((vector<Production_*,_std::allocator<Production_*>_> *)((long)pCVar9 + 0x30))->
                  super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
  }
  if (1 < iVar10) {
    findPermutations((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *)local_108,pCVar9,iVar10);
    this_01 = (CFG *)local_108;
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::vector(&local_48,
             (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              *)this_01);
    filterAll0orAll1((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *)(local_108 + 0x40),this_01,&local_48);
    local_128 = (pointer)local_108._16_8_;
    local_138._8_8_ = local_108._8_8_;
    local_138._0_8_ = local_108._0_8_;
    local_108._0_8_ = local_108._64_8_;
    local_108._8_8_ = local_108._72_8_;
    local_108._16_8_ = local_108._80_8_;
    local_108._64_8_ = (Production *)0x0;
    local_108._72_8_ = (Production *)0x0;
    local_108._80_8_ = (pointer)0x0;
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *)local_138);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *)(local_108 + 0x40));
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::~vector(&local_48);
    local_80 = (Production *)local_108._8_8_;
    if (local_108._0_8_ != local_108._8_8_) {
      local_88 = (vector<Production*,std::allocator<Production*>> *)((long)pCVar9 + 0x30);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + 0x40);
      local_70 = 0x800000000000003f;
      pPVar5 = (Production *)local_108._0_8_;
      do {
        local_78 = pPVar5;
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_138,
                   (vector<bool,_std::allocator<bool>_> *)pPVar5);
        local_108._64_8_ = (Production *)0x0;
        local_108._72_8_ = (Production *)0x0;
        local_108._80_8_ = (pointer)0x0;
        if (local_108._48_8_ != local_108._40_8_) {
          lVar8 = 0;
          uVar11 = 0;
          iVar10 = 0;
          do {
            sVar2 = *(size_t *)((long)(local_108._40_8_ + 8) + lVar8);
            pvVar12 = (value_type *)((long)&((_Alloc_hider *)local_108._40_8_)->_M_p + lVar8);
            if ((sVar2 == symbol->_M_string_length) &&
               ((sVar2 == 0 ||
                (iVar4 = bcmp((pvVar12->_M_dataplus)._M_p,(symbol->_M_dataplus)._M_p,sVar2),
                iVar4 == 0)))) {
              uVar6 = (ulong)iVar10;
              uVar7 = uVar6 + 0x3f;
              if (-1 < (long)uVar6) {
                uVar7 = uVar6;
              }
              if ((*(ulong *)(local_138._0_8_ +
                             (ulong)((uVar6 & local_70) < 0x8000000000000001) * 8 +
                             ((long)uVar7 >> 6) * 8 + -8) >> (uVar6 & 0x3f) & 1) != 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(this_00,pvVar12);
              }
              iVar10 = iVar10 + 1;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this_00,pvVar12);
            }
            uVar11 = uVar11 + 1;
            lVar8 = lVar8 + 0x20;
          } while (uVar11 < (ulong)((long)(local_108._48_8_ - local_108._40_8_) >> 5));
        }
        pPVar5 = (Production *)operator_new(0x38);
        pCVar9 = (CFG *)local_108._32_8_;
        Production::Production(pPVar5,(string *)local_108._24_8_,this_00);
        iVar3._M_current =
             (((vector<Production_*,_std::allocator<Production_*>_> *)((long)pCVar9 + 0x30))->
             super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_50 = pPVar5;
        if (iVar3._M_current ==
            (((vector<Production_*,_std::allocator<Production_*>_> *)((long)pCVar9 + 0x30))->
            super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Production*,std::allocator<Production*>>::_M_realloc_insert<Production*const&>
                    (local_88,iVar3,&local_50);
        }
        else {
          *iVar3._M_current = pPVar5;
          pppPVar1 = &(((vector<Production_*,_std::allocator<Production_*>_> *)((long)pCVar9 + 0x30)
                       )->super__Vector_base<Production_*,_std::allocator<Production_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppPVar1 = *pppPVar1 + 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this_00);
        if ((Production *)local_138._0_8_ != (Production *)0x0) {
          operator_delete((void *)local_138._0_8_,(long)local_118 - local_138._0_8_);
          local_138._0_8_ = (Production *)0x0;
          local_138._8_8_ = local_138._8_8_ & 0xffffffff00000000;
          local_128 = (pointer)0x0;
          local_120 = 0;
          local_118 = (_Bit_pointer)0x0;
        }
        pPVar5 = (Production *)
                 &(local_78->toP).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (pPVar5 != local_80);
    }
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *)local_108);
  }
  __x = &pCVar9->productionsP;
  pCVar9 = (CFG *)__x;
  std::vector<Production_*,_std::allocator<Production_*>_>::vector(&local_68,__x);
  removeDoubleProductions
            ((vector<Production_*,_std::allocator<Production_*>_> *)local_138,pCVar9,&local_68);
  std::vector<Production_*,_std::allocator<Production_*>_>::_M_move_assign(__x,local_138);
  if ((Production *)local_138._0_8_ != (Production *)0x0) {
    operator_delete((void *)local_138._0_8_,(long)local_128 - local_138._0_8_);
  }
  if (local_68.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_108 + 0x60));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_108 + 0x28));
  return;
}

Assistant:

void CFG::removeNullableSymbol(std::string symbol, Production *production) {
    bool changed = false;
    std::vector<std::string> productionsTo = production->getToP();
    std::vector<std::string> withoutSymbol = {};
    int symbolCount = 0;
    for (int i = 0; i < productionsTo.size(); ++i) {
        if (productionsTo[i] != symbol) {
            withoutSymbol.push_back(productionsTo[i]);
        } else {
            symbolCount++;
            changed = true;
        }
    }
    if (changed) {
        Production *newProduction = new Production(production->getFromP(), withoutSymbol);
        productionsP.push_back(newProduction);
    }

    if (symbolCount > 1) {
        std::vector<std::vector<bool>> permutations = findPermutations(symbolCount);
        permutations = filterAll0orAll1(permutations); // Since already included

        for (auto permu: permutations) {
            std::vector<std::string> withoutSymbol = {};
            int symbolCount = 0;
            for (int i = 0; i < productionsTo.size(); ++i) {
                if (productionsTo[i] != symbol) {
                    withoutSymbol.push_back(productionsTo[i]);
                } else {
                    if (permu[symbolCount]) {
                        withoutSymbol.push_back(productionsTo[i]);
                    }
                    symbolCount++;
                }
            }
            Production *newProduction = new Production(production->getFromP(), withoutSymbol);
            productionsP.push_back(newProduction);
        }
    }

    productionsP = removeDoubleProductions(productionsP);
}